

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::hasFamily(QString *family)

{
  QtFontFamily *pQVar1;
  int iVar2;
  int iVar3;
  Type *mutex;
  QArrayDataPointer<char16_t> *this;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_38 [24];
  long local_20;
  
  this = &local_98;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  parseFontName(family,(QString *)&local_78,(QString *)&local_58);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFontDatabasePrivate::resolveFontFamilyAlias((QString *)&local_98,(QString *)&local_58);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)this);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  lVar4 = 0;
  iVar2 = QFontDatabasePrivate::instance::instance.count;
  while ((lVar5 = (long)iVar2, lVar4 < lVar5 &&
         (((pQVar1 = QFontDatabasePrivate::instance::instance.families[lVar4],
           (undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) !=
           (undefined1  [112])0x0 && (pQVar1->count == 0)) ||
          (iVar3 = QString::compare((QString *)&local_98,(int)pQVar1 + 8),
          iVar2 = QFontDatabasePrivate::instance::instance.count, iVar3 != 0))))) {
    lVar4 = lVar4 + 1;
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return lVar4 < lVar5;
}

Assistant:

bool QFontDatabase::hasFamily(const QString &family)
{
    QString parsedFamily, foundry;
    parseFontName(family, foundry, parsedFamily);
    const QString familyAlias = QFontDatabasePrivate::resolveFontFamilyAlias(parsedFamily);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (familyAlias.compare(f->name, Qt::CaseInsensitive) == 0)
            return true;
    }

    return false;
}